

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::cpp::SuperClassName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,Descriptor *descriptor,Options *options)

{
  bool bVar1;
  FileDescriptor *file;
  Options *extraout_RDX;
  undefined1 auVar2 [16];
  string local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined4 local_d4;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_90 [8];
  string simple_base;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  Options *local_20;
  Options *options_local;
  Descriptor *descriptor_local;
  
  local_20 = (Options *)descriptor;
  options_local = (Options *)this;
  descriptor_local = (Descriptor *)__return_storage_ptr__;
  file = Descriptor::file((Descriptor *)this);
  bVar1 = HasDescriptorMethods(file,local_20);
  if (bVar1) {
    SimpleBaseClass_abi_cxx11_
              ((string *)local_90,(cpp *)options_local,(Descriptor *)local_20,options);
    auVar2 = std::__cxx11::string::empty();
    if ((auVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      ProtobufNamespace_abi_cxx11_(&local_138,(cpp *)local_20,auVar2._8_8_);
      std::operator+(&local_118,"::",&local_138);
      std::operator+(&local_f8,&local_118,"::internal::");
      std::operator+(__return_storage_ptr__,&local_f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_138);
    }
    else {
      ProtobufNamespace_abi_cxx11_(&local_d0,(cpp *)local_20,auVar2._8_8_);
      std::operator+(&local_b0,"::",&local_d0);
      std::operator+(__return_storage_ptr__,&local_b0,"::Message");
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
    }
    local_d4 = 1;
    std::__cxx11::string::~string((string *)local_90);
  }
  else {
    ProtobufNamespace_abi_cxx11_(&local_60,(cpp *)local_20,extraout_RDX);
    std::operator+(&local_40,"::",&local_60);
    std::operator+(__return_storage_ptr__,&local_40,"::MessageLite");
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SuperClassName(const Descriptor* descriptor,
                           const Options& options) {
  if (!HasDescriptorMethods(descriptor->file(), options)) {
    return "::" + ProtobufNamespace(options) + "::MessageLite";
  }
  auto simple_base = SimpleBaseClass(descriptor, options);
  if (simple_base.empty()) {
    return "::" + ProtobufNamespace(options) + "::Message";
  }
  return "::" + ProtobufNamespace(options) + "::internal::" + simple_base;
}